

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  pointer pMVar6;
  long *plVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  size_t sVar14;
  ulong uVar15;
  pointer pBVar16;
  long lVar17;
  long lVar18;
  size_t *psVar19;
  int *piVar20;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  Mat shape_hints;
  char layer_type [256];
  char layer_name [256];
  int local_3e8;
  int local_3e4;
  Layer *local_3e0;
  Mat local_3d8;
  Net *local_390;
  long local_388;
  DataReader *local_380;
  int local_378;
  int local_374;
  vector<int,_std::allocator<int>_> *local_370;
  vector<int,_std::allocator<int>_> *local_368;
  ulong local_360;
  int local_354;
  string *local_350;
  ParamDict local_348;
  Mat local_338 [3];
  char local_238 [256];
  char local_138 [264];
  
  local_354 = 0;
  iVar12 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar12 == 1) {
    if (local_354 == 0x7685dd) {
      local_374 = 0;
      local_378 = 0;
      iVar12 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar12 == 1) {
        iVar12 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_378);
        if (iVar12 == 1) {
          if ((0 < (long)local_374) && (0 < local_378)) {
            local_380 = dr;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_374);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_378);
            ParamDict::ParamDict(&local_348);
            bVar8 = 0 < local_374;
            if (0 < local_374) {
              local_388 = 0;
              uVar15 = 0;
              local_390 = this;
              do {
                psVar19 = &local_338[0].elemsize;
                local_3e4 = 0;
                local_3e8 = 0;
                iVar12 = (*local_380->_vptr_DataReader[2])(local_380,"%255s",local_238);
                if (iVar12 == 1) {
                  iVar12 = (*local_380->_vptr_DataReader[2])(local_380,"%255s",local_138);
                  if (iVar12 != 1) {
                    load_param();
                    goto LAB_001493de;
                  }
                  iVar12 = (*local_380->_vptr_DataReader[2])(local_380,"%d",&local_3e4);
                  if (iVar12 != 1) {
                    load_param();
                    goto LAB_001493de;
                  }
                  iVar12 = (*local_380->_vptr_DataReader[2])(local_380,"%d",&local_3e8);
                  if (iVar12 != 1) {
                    load_param();
                    goto LAB_001493de;
                  }
                  local_3e0 = create_layer(local_238);
                  if (local_3e0 == (Layer *)0x0) {
                    iVar12 = (*this->_vptr_Net[3])(this,local_238);
                    local_3e0 = (Layer *)CONCAT44(extraout_var,iVar12);
                  }
                  if (local_3e0 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %s not exists or registered",local_238);
                    this = local_390;
                    fputc(10,_stderr);
                    clear(this);
                    iVar12 = 1;
                  }
                  else {
                    local_338[0].data = psVar19;
                    sVar14 = strlen(local_238);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_338,local_238,local_238 + sVar14);
                    std::__cxx11::string::operator=((string *)&local_3e0->type,(string *)local_338);
                    if ((size_t *)local_338[0].data != psVar19) {
                      operator_delete(local_338[0].data,
                                      CONCAT44(local_338[0].elemsize._4_4_,
                                               (undefined4)local_338[0].elemsize) + 1);
                    }
                    local_338[0].data = psVar19;
                    sVar14 = strlen(local_138);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_338,local_138,local_138 + sVar14);
                    local_350 = &local_3e0->name;
                    std::__cxx11::string::operator=((string *)local_350,(string *)local_338);
                    this = local_390;
                    if ((size_t *)local_338[0].data != psVar19) {
                      operator_delete(local_338[0].data,
                                      CONCAT44(local_338[0].elemsize._4_4_,
                                               (undefined4)local_338[0].elemsize) + 1);
                    }
                    local_368 = &local_3e0->bottoms;
                    std::vector<int,_std::allocator<int>_>::resize(local_368,(long)local_3e4);
                    local_370 = (vector<int,_std::allocator<int>_> *)
                                CONCAT71(local_370._1_7_,0 < local_3e4);
                    iVar12 = 0x19;
                    if (0 < local_3e4) {
                      lVar17 = 0;
                      do {
                        iVar12 = (*local_380->_vptr_DataReader[2])(local_380,"%255s",local_338);
                        if (iVar12 == 1) {
                          iVar13 = find_blob_index_by_name(this,(char *)local_338);
                          if (iVar13 == -1) {
                            pBVar16 = (this->d->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_start;
                            local_3d8.data = &local_3d8.elemsize;
                            sVar14 = strlen((char *)local_338);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_3d8,local_338,
                                       (long)&local_338[0].data + sVar14);
                            iVar13 = (int)uVar15;
                            std::__cxx11::string::operator=
                                      ((string *)(pBVar16 + iVar13),(string *)&local_3d8);
                            if ((size_t *)local_3d8.data != &local_3d8.elemsize) {
                              operator_delete(local_3d8.data,
                                              CONCAT44(local_3d8.elemsize._4_4_,
                                                       (undefined4)local_3d8.elemsize) + 1);
                            }
                            uVar15 = (ulong)(iVar13 + 1);
                            this = local_390;
                          }
                          (this->d->blobs).
                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar13].consumer = (int)local_388;
                          (local_368->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar17] = iVar13;
                        }
                        else {
                          load_param();
                        }
                        if (iVar12 != 1) {
                          iVar12 = 1;
                          goto LAB_001491bc;
                        }
                        lVar17 = lVar17 + 1;
                        local_370 = (vector<int,_std::allocator<int>_> *)
                                    CONCAT71(local_370._1_7_,lVar17 < local_3e4);
                      } while (lVar17 < local_3e4);
                      iVar12 = 0x19;
                    }
LAB_001491bc:
                    if (((ulong)local_370 & 1) == 0) {
                      local_370 = &local_3e0->tops;
                      std::vector<int,_std::allocator<int>_>::resize(local_370,(long)local_3e8);
                      bVar9 = 0 < local_3e8;
                      iVar12 = 0x1e;
                      if (0 < local_3e8) {
                        lVar17 = 0;
                        do {
                          iVar13 = (int)uVar15;
                          pBVar16 = (this->d->blobs).
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                    _M_impl.super__Vector_impl_data._M_start + iVar13;
                          iVar12 = (*local_380->_vptr_DataReader[2])(local_380,"%255s",local_338);
                          if (iVar12 == 1) {
                            local_360 = CONCAT44(local_360._4_4_,1);
                            local_3d8.data = &local_3d8.elemsize;
                            sVar14 = strlen((char *)local_338);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_3d8,local_338,
                                       (long)&local_338[0].data + sVar14);
                            std::__cxx11::string::operator=((string *)pBVar16,(string *)&local_3d8);
                            if ((size_t *)local_3d8.data != &local_3d8.elemsize) {
                              operator_delete(local_3d8.data,
                                              CONCAT44(local_3d8.elemsize._4_4_,
                                                       (undefined4)local_3d8.elemsize) + 1);
                            }
                            pBVar16->producer = (int)local_388;
                            (local_370->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar17] = iVar13;
                            uVar15 = (ulong)(iVar13 + 1);
                            this = local_390;
                            iVar12 = (int)local_360;
                          }
                          else {
                            load_param();
                          }
                          if (iVar12 != 1) {
                            iVar12 = 1;
                            goto LAB_00149318;
                          }
                          lVar17 = lVar17 + 1;
                          bVar9 = lVar17 < local_3e8;
                        } while (lVar17 < local_3e8);
                        iVar12 = 0x1e;
                      }
LAB_00149318:
                      if (!bVar9) {
                        iVar12 = ParamDict::load_param(&local_348,local_380);
                        if (iVar12 == 0) {
                          if (local_3e0->support_int8_storage == true) {
                            (this->opt).use_vulkan_compute = false;
                          }
                          local_3d8.cstep = 0;
                          local_3d8.data = (void *)0x0;
                          local_3d8.refcount._0_4_ = 0;
                          local_3d8.refcount._4_4_ = 0;
                          local_3d8.elemsize._0_4_ = 0;
                          local_3d8.elemsize._4_4_ = 0;
                          local_3d8.elempack = 0;
                          local_3d8.h = 0;
                          local_3d8.d = 0;
                          local_3d8.c = 0;
                          local_3d8.allocator = (Allocator *)0x0;
                          local_3d8.dims = 0;
                          local_3d8.w = 0;
                          local_360 = uVar15;
                          ParamDict::get(local_338,&local_348,0x1e,&local_3d8);
                          piVar20 = (int *)CONCAT44(local_3d8.refcount._4_4_,
                                                    local_3d8.refcount._0_4_);
                          if (piVar20 != (int *)0x0) {
                            LOCK();
                            *piVar20 = *piVar20 + -1;
                            UNLOCK();
                            if (*piVar20 == 0) {
                              if (local_3d8.allocator == (Allocator *)0x0) {
                                if (local_3d8.data != (void *)0x0) {
                                  free(local_3d8.data);
                                }
                              }
                              else {
                                (*(local_3d8.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          if ((((size_t *)local_338[0].data != (size_t *)0x0) &&
                              ((long)local_338[0].c * local_338[0].cstep != 0)) && (0 < local_3e8))
                          {
                            piVar20 = (int *)((long)local_338[0].data + 0xc);
                            lVar17 = 0;
                            do {
                              iVar12 = (local_370->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar17];
                              pBVar16 = (local_390->d->blobs).
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                        _M_impl.super__Vector_impl_data._M_start;
                              iVar13 = piVar20[-3];
                              if (iVar13 == 3) {
LAB_0014976d:
                                local_3d8.w = piVar20[-2];
                                local_3d8.h = piVar20[-1];
                                local_3d8.c = *piVar20;
                                local_3d8.data = (void *)0x0;
                                local_3d8.refcount._0_4_ = 0;
                                local_3d8.refcount._4_4_ = 0;
                                local_3d8.elemsize._0_4_ = 4;
                                local_3d8.elemsize._4_4_ = 0;
                                local_3d8.elempack = 1;
                                local_3d8.allocator = (Allocator *)0x0;
                                local_3d8.dims = 3;
                                local_3d8.d = 1;
                                local_3d8.cstep =
                                     (long)local_3d8.h * (long)local_3d8.w + 3U & 0x3ffffffffffffffc
                                ;
                                if (&pBVar16[iVar12].shape != &local_3d8) {
                                  piVar3 = pBVar16[iVar12].shape.refcount;
                                  if (piVar3 != (int *)0x0) {
                                    LOCK();
                                    *piVar3 = *piVar3 + -1;
                                    UNLOCK();
                                    if (*piVar3 == 0) {
                                      pvVar4 = pBVar16[iVar12].shape.data;
                                      pAVar5 = pBVar16[iVar12].shape.allocator;
                                      if (pAVar5 == (Allocator *)0x0) {
                                        if (pvVar4 != (void *)0x0) {
                                          free(pvVar4);
                                        }
                                      }
                                      else {
                                        (*pAVar5->_vptr_Allocator[3])();
                                      }
                                    }
                                  }
                                  pBVar16[iVar12].shape.cstep = 0;
                                  *(undefined8 *)((long)&pBVar16[iVar12].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar16[iVar12].shape.elemsize + 4) = 0;
                                  pBVar16[iVar12].shape.data = (void *)0x0;
                                  pBVar16[iVar12].shape.refcount = (int *)0x0;
                                  pBVar16[iVar12].shape.dims = 0;
                                  pBVar16[iVar12].shape.w = 0;
                                  pBVar16[iVar12].shape.h = 0;
                                  pBVar16[iVar12].shape.d = 0;
                                  pBVar16[iVar12].shape.c = 0;
                                  pBVar16[iVar12].shape.data = local_3d8.data;
                                  pBVar16[iVar12].shape.refcount =
                                       (int *)CONCAT44(local_3d8.refcount._4_4_,
                                                       local_3d8.refcount._0_4_);
                                  pBVar16[iVar12].shape.elemsize =
                                       CONCAT44(local_3d8.elemsize._4_4_,
                                                (undefined4)local_3d8.elemsize);
                                  pBVar16[iVar12].shape.elempack = local_3d8.elempack;
                                  pBVar16[iVar12].shape.allocator = local_3d8.allocator;
                                  pBVar16[iVar12].shape.dims = local_3d8.dims;
                                  pBVar16[iVar12].shape.w = local_3d8.w;
                                  pBVar16[iVar12].shape.h = local_3d8.h;
                                  pBVar16[iVar12].shape.d = local_3d8.d;
                                  pBVar16[iVar12].shape.c = local_3d8.c;
                                  pBVar16[iVar12].shape.cstep = local_3d8.cstep;
                                }
                                piVar3 = (int *)CONCAT44(local_3d8.refcount._4_4_,
                                                         local_3d8.refcount._0_4_);
                                if (piVar3 != (int *)0x0) {
                                  LOCK();
                                  *piVar3 = *piVar3 + -1;
                                  UNLOCK();
                                  if (*piVar3 == 0) {
                                    if (local_3d8.allocator == (Allocator *)0x0) {
                                      if (local_3d8.data != (void *)0x0) {
                                        free(local_3d8.data);
                                      }
                                    }
                                    else {
                                      (*(local_3d8.allocator)->_vptr_Allocator[3])();
                                    }
                                  }
                                }
                              }
                              else if (iVar13 == 2) {
                                local_3d8.w = piVar20[-2];
                                local_3d8.h = piVar20[-1];
                                local_3d8.data = (void *)0x0;
                                local_3d8.refcount._0_4_ = 0;
                                local_3d8.refcount._4_4_ = 0;
                                local_3d8.elemsize._0_4_ = 4;
                                local_3d8.elemsize._4_4_ = 0;
                                local_3d8.elempack = 1;
                                local_3d8.allocator = (Allocator *)0x0;
                                local_3d8.dims = 2;
                                local_3d8.d = 1;
                                local_3d8.c = 1;
                                local_3d8.cstep = (long)local_3d8.h * (long)local_3d8.w;
                                if (&pBVar16[iVar12].shape != &local_3d8) {
                                  piVar3 = pBVar16[iVar12].shape.refcount;
                                  if (piVar3 != (int *)0x0) {
                                    LOCK();
                                    *piVar3 = *piVar3 + -1;
                                    UNLOCK();
                                    if (*piVar3 == 0) {
                                      pvVar4 = pBVar16[iVar12].shape.data;
                                      pAVar5 = pBVar16[iVar12].shape.allocator;
                                      if (pAVar5 == (Allocator *)0x0) {
                                        if (pvVar4 != (void *)0x0) {
                                          free(pvVar4);
                                        }
                                      }
                                      else {
                                        (*pAVar5->_vptr_Allocator[3])();
                                      }
                                    }
                                  }
                                  pBVar16[iVar12].shape.cstep = 0;
                                  *(undefined8 *)((long)&pBVar16[iVar12].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar16[iVar12].shape.elemsize + 4) = 0;
                                  pBVar16[iVar12].shape.data = (void *)0x0;
                                  pBVar16[iVar12].shape.refcount = (int *)0x0;
                                  pBVar16[iVar12].shape.dims = 0;
                                  pBVar16[iVar12].shape.w = 0;
                                  pBVar16[iVar12].shape.h = 0;
                                  pBVar16[iVar12].shape.d = 0;
                                  pBVar16[iVar12].shape.c = 0;
                                  pBVar16[iVar12].shape.data = local_3d8.data;
                                  pBVar16[iVar12].shape.refcount =
                                       (int *)CONCAT44(local_3d8.refcount._4_4_,
                                                       local_3d8.refcount._0_4_);
                                  pBVar16[iVar12].shape.elemsize =
                                       CONCAT44(local_3d8.elemsize._4_4_,
                                                (undefined4)local_3d8.elemsize);
                                  pBVar16[iVar12].shape.elempack = local_3d8.elempack;
                                  pBVar16[iVar12].shape.allocator = local_3d8.allocator;
                                  pBVar16[iVar12].shape.dims = local_3d8.dims;
                                  pBVar16[iVar12].shape.w = local_3d8.w;
                                  pBVar16[iVar12].shape.h = local_3d8.h;
                                  pBVar16[iVar12].shape.d = local_3d8.d;
                                  pBVar16[iVar12].shape.c = local_3d8.c;
                                  pBVar16[iVar12].shape.cstep = local_3d8.cstep;
                                }
                                piVar3 = (int *)CONCAT44(local_3d8.refcount._4_4_,
                                                         local_3d8.refcount._0_4_);
                                if (piVar3 != (int *)0x0) {
                                  LOCK();
                                  *piVar3 = *piVar3 + -1;
                                  UNLOCK();
                                  if (*piVar3 == 0) {
                                    if (local_3d8.allocator == (Allocator *)0x0) {
                                      if (local_3d8.data != (void *)0x0) {
                                        free(local_3d8.data);
                                      }
                                    }
                                    else {
                                      (*(local_3d8.allocator)->_vptr_Allocator[3])();
                                    }
                                  }
                                }
LAB_00149763:
                                if (iVar13 == 3) goto LAB_0014976d;
                              }
                              else if (iVar13 == 1) {
                                local_3d8.w = piVar20[-2];
                                local_3d8.cstep = (size_t)local_3d8.w;
                                local_3d8.data = (void *)0x0;
                                local_3d8.refcount._0_4_ = 0;
                                local_3d8.refcount._4_4_ = 0;
                                local_3d8.elemsize._0_4_ = 4;
                                local_3d8.elemsize._4_4_ = 0;
                                local_3d8.elempack = 1;
                                local_3d8.allocator = (Allocator *)0x0;
                                local_3d8.dims = 1;
                                local_3d8.h = 1;
                                local_3d8.d = 1;
                                local_3d8.c = 1;
                                if (&pBVar16[iVar12].shape != &local_3d8) {
                                  piVar3 = pBVar16[iVar12].shape.refcount;
                                  if (piVar3 != (int *)0x0) {
                                    LOCK();
                                    *piVar3 = *piVar3 + -1;
                                    UNLOCK();
                                    if (*piVar3 == 0) {
                                      pvVar4 = pBVar16[iVar12].shape.data;
                                      pAVar5 = pBVar16[iVar12].shape.allocator;
                                      if (pAVar5 == (Allocator *)0x0) {
                                        if (pvVar4 != (void *)0x0) {
                                          free(pvVar4);
                                        }
                                      }
                                      else {
                                        (*pAVar5->_vptr_Allocator[3])();
                                      }
                                    }
                                  }
                                  pBVar16[iVar12].shape.cstep = 0;
                                  *(undefined8 *)((long)&pBVar16[iVar12].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar16[iVar12].shape.elemsize + 4) = 0;
                                  pBVar16[iVar12].shape.data = (void *)0x0;
                                  pBVar16[iVar12].shape.refcount = (int *)0x0;
                                  pBVar16[iVar12].shape.dims = 0;
                                  pBVar16[iVar12].shape.w = 0;
                                  pBVar16[iVar12].shape.h = 0;
                                  pBVar16[iVar12].shape.d = 0;
                                  pBVar16[iVar12].shape.c = 0;
                                  pBVar16[iVar12].shape.data = local_3d8.data;
                                  pBVar16[iVar12].shape.refcount =
                                       (int *)CONCAT44(local_3d8.refcount._4_4_,
                                                       local_3d8.refcount._0_4_);
                                  pBVar16[iVar12].shape.elemsize =
                                       CONCAT44(local_3d8.elemsize._4_4_,
                                                (undefined4)local_3d8.elemsize);
                                  pBVar16[iVar12].shape.elempack = local_3d8.elempack;
                                  pBVar16[iVar12].shape.allocator = local_3d8.allocator;
                                  pBVar16[iVar12].shape.dims = local_3d8.dims;
                                  pBVar16[iVar12].shape.w = local_3d8.w;
                                  pBVar16[iVar12].shape.h = local_3d8.h;
                                  pBVar16[iVar12].shape.d = local_3d8.d;
                                  pBVar16[iVar12].shape.c = local_3d8.c;
                                  pBVar16[iVar12].shape.cstep = local_3d8.cstep;
                                }
                                piVar3 = (int *)CONCAT44(local_3d8.refcount._4_4_,
                                                         local_3d8.refcount._0_4_);
                                if (piVar3 != (int *)0x0) {
                                  LOCK();
                                  *piVar3 = *piVar3 + -1;
                                  UNLOCK();
                                  if (*piVar3 == 0) {
                                    if (local_3d8.allocator == (Allocator *)0x0) {
                                      if (local_3d8.data != (void *)0x0) {
                                        free(local_3d8.data);
                                      }
                                    }
                                    else {
                                      (*(local_3d8.allocator)->_vptr_Allocator[3])();
                                    }
                                  }
                                }
                                goto LAB_00149763;
                              }
                              lVar17 = lVar17 + 1;
                              piVar20 = piVar20 + 4;
                            } while (lVar17 < local_3e8);
                          }
                          local_3d8.d = 0;
                          local_3d8.h = 0;
                          local_3d8.w = 0;
                          local_3d8.dims = 0;
                          local_3d8.elempack = 0;
                          local_3d8.elemsize._4_4_ = 0;
                          local_3d8.elemsize._0_4_ = 0;
                          local_3d8.refcount._4_4_ = 0;
                          local_3d8.refcount._0_4_ = 0;
                          local_3d8.cstep = 0;
                          local_3d8.c = 0;
                          local_3d8.data = (size_t *)0x0;
                          pvVar1 = &local_3e0->bottom_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_3e4);
                          if (0 < local_3e4) {
                            lVar17 = 0;
                            lVar18 = 0;
                            do {
                              iVar12 = (local_368->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar18];
                              pBVar16 = (local_390->d->blobs).
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                        _M_impl.super__Vector_impl_data._M_start;
                              pMVar6 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar6->data + lVar17);
                              if ((Mat *)puVar2 != &pBVar16[iVar12].shape) {
                                piVar20 = pBVar16[iVar12].shape.refcount;
                                if (piVar20 != (int *)0x0) {
                                  LOCK();
                                  *piVar20 = *piVar20 + 1;
                                  UNLOCK();
                                }
                                piVar20 = *(int **)((long)&pMVar6->refcount + lVar17);
                                if (piVar20 != (int *)0x0) {
                                  LOCK();
                                  *piVar20 = *piVar20 + -1;
                                  UNLOCK();
                                  if (*piVar20 == 0) {
                                    pvVar4 = *(void **)((long)&pMVar6->data + lVar17);
                                    plVar7 = *(long **)((long)&pMVar6->allocator + lVar17);
                                    if (plVar7 == (long *)0x0) {
                                      if (pvVar4 != (void *)0x0) {
                                        free(pvVar4);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar7 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)&pMVar6->cstep + lVar17) = 0;
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar6->dims + lVar17);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined4 *)((long)&pMVar6->c + lVar17) = 0;
                                piVar20 = pBVar16[iVar12].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar6->data + lVar17);
                                *puVar2 = pBVar16[iVar12].shape.data;
                                puVar2[1] = piVar20;
                                *(size_t *)((long)&pMVar6->elemsize + lVar17) =
                                     pBVar16[iVar12].shape.elemsize;
                                *(int *)((long)&pMVar6->elempack + lVar17) =
                                     pBVar16[iVar12].shape.elempack;
                                *(Allocator **)((long)&pMVar6->allocator + lVar17) =
                                     pBVar16[iVar12].shape.allocator;
                                iVar13 = pBVar16[iVar12].shape.w;
                                iVar10 = pBVar16[iVar12].shape.h;
                                iVar11 = pBVar16[iVar12].shape.d;
                                piVar20 = (int *)((long)&pMVar6->dims + lVar17);
                                *piVar20 = pBVar16[iVar12].shape.dims;
                                piVar20[1] = iVar13;
                                piVar20[2] = iVar10;
                                piVar20[3] = iVar11;
                                *(int *)((long)&pMVar6->c + lVar17) = pBVar16[iVar12].shape.c;
                                *(size_t *)((long)&pMVar6->cstep + lVar17) =
                                     pBVar16[iVar12].shape.cstep;
                              }
                              lVar18 = lVar18 + 1;
                              lVar17 = lVar17 + 0x48;
                            } while (lVar18 < local_3e4);
                          }
                          this = local_390;
                          pvVar1 = &local_3e0->top_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_3e8);
                          if (0 < local_3e8) {
                            lVar17 = 0;
                            lVar18 = 0;
                            do {
                              iVar12 = (local_370->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar18];
                              pBVar16 = (this->d->blobs).
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                        _M_impl.super__Vector_impl_data._M_start;
                              pMVar6 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar6->data + lVar17);
                              if ((Mat *)puVar2 != &pBVar16[iVar12].shape) {
                                piVar20 = pBVar16[iVar12].shape.refcount;
                                if (piVar20 != (int *)0x0) {
                                  LOCK();
                                  *piVar20 = *piVar20 + 1;
                                  UNLOCK();
                                }
                                piVar20 = *(int **)((long)&pMVar6->refcount + lVar17);
                                if (piVar20 != (int *)0x0) {
                                  LOCK();
                                  *piVar20 = *piVar20 + -1;
                                  UNLOCK();
                                  if (*piVar20 == 0) {
                                    pvVar4 = *(void **)((long)&pMVar6->data + lVar17);
                                    plVar7 = *(long **)((long)&pMVar6->allocator + lVar17);
                                    if (plVar7 == (long *)0x0) {
                                      if (pvVar4 != (void *)0x0) {
                                        free(pvVar4);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar7 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)&pMVar6->cstep + lVar17) = 0;
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar6->dims + lVar17);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined4 *)((long)&pMVar6->c + lVar17) = 0;
                                piVar20 = pBVar16[iVar12].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar6->data + lVar17);
                                *puVar2 = pBVar16[iVar12].shape.data;
                                puVar2[1] = piVar20;
                                *(size_t *)((long)&pMVar6->elemsize + lVar17) =
                                     pBVar16[iVar12].shape.elemsize;
                                *(int *)((long)&pMVar6->elempack + lVar17) =
                                     pBVar16[iVar12].shape.elempack;
                                *(Allocator **)((long)&pMVar6->allocator + lVar17) =
                                     pBVar16[iVar12].shape.allocator;
                                iVar13 = pBVar16[iVar12].shape.w;
                                iVar10 = pBVar16[iVar12].shape.h;
                                iVar11 = pBVar16[iVar12].shape.d;
                                piVar20 = (int *)((long)&pMVar6->dims + lVar17);
                                *piVar20 = pBVar16[iVar12].shape.dims;
                                piVar20[1] = iVar13;
                                piVar20[2] = iVar10;
                                piVar20[3] = iVar11;
                                *(int *)((long)&pMVar6->c + lVar17) = pBVar16[iVar12].shape.c;
                                *(size_t *)((long)&pMVar6->cstep + lVar17) =
                                     pBVar16[iVar12].shape.cstep;
                              }
                              lVar18 = lVar18 + 1;
                              lVar17 = lVar17 + 0x48;
                              this = local_390;
                            } while (lVar18 < local_3e8);
                          }
                          iVar12 = (*local_3e0->_vptr_Layer[2])(local_3e0,&local_348);
                          uVar15 = local_360;
                          if (iVar12 == 0) {
                            (this->d->layers).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[local_388] = local_3e0;
                            local_368 = (vector<int,_std::allocator<int>_> *)
                                        ((ulong)local_368 & 0xffffffff00000000);
                          }
                          else {
                            load_param();
                            local_368 = (vector<int,_std::allocator<int>_> *)
                                        CONCAT44(local_368._4_4_,0xe);
                          }
                          piVar20 = (int *)CONCAT44(local_338[0].refcount._4_4_,
                                                    local_338[0].refcount._0_4_);
                          if (piVar20 != (int *)0x0) {
                            LOCK();
                            *piVar20 = *piVar20 + -1;
                            UNLOCK();
                            if (*piVar20 == 0) {
                              if (local_338[0].allocator == (Allocator *)0x0) {
                                if ((size_t *)local_338[0].data != (size_t *)0x0) {
                                  free(local_338[0].data);
                                }
                              }
                              else {
                                (*(local_338[0].allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_338[0].cstep = 0;
                          local_338[0].data = (size_t *)0x0;
                          local_338[0].refcount._0_4_ = 0;
                          local_338[0].refcount._4_4_ = 0;
                          local_338[0].elemsize._0_4_ = 0;
                          local_338[0].elemsize._4_4_ = 0;
                          local_338[0].elempack = 0;
                          local_338[0].dims = 0;
                          local_338[0].w = 0;
                          local_338[0].h = 0;
                          local_338[0].d = 0;
                          local_338[0].c = 0;
                          iVar12 = (int)local_368;
                        }
                        else {
                          load_param();
                          iVar12 = 0xe;
                        }
                      }
                    }
                  }
                }
                else {
                  load_param();
LAB_001493de:
                  iVar12 = 1;
                }
                if ((iVar12 != 0xe) && (iVar12 != 0)) {
                  iVar12 = -1;
                  if (bVar8) goto LAB_00149c71;
                  break;
                }
                local_388 = local_388 + 1;
                bVar8 = local_388 < local_374;
              } while (local_388 < local_374);
            }
            NetPrivate::update_input_output_indexes(this->d);
            iVar12 = 0;
            NetPrivate::update_input_output_names(this->d);
LAB_00149c71:
            ParamDict::~ParamDict(&local_348);
            return iVar12;
          }
          load_param();
        }
        else {
          load_param();
        }
      }
      else {
        load_param();
      }
    }
    else {
      load_param();
    }
  }
  else {
    load_param();
  }
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}